

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

uint64_t my_ntohll(uint64_t *original)

{
  ulong uVar1;
  
  uVar1 = *original;
  return uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
}

Assistant:

uint64_t my_ntohll(const uint64_t& original)
{
#ifdef SPARC_V9  // big endian
    return original;
#else  // little endian
    return (static_cast<uint64_t>(my_ntohl(static_cast<uint32_t>(original))) << 32) |
           static_cast<uint64_t>(my_ntohl(static_cast<uint32_t>(original >> 32)));
#endif
}